

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ClassPropertySymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ClassPropertySymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime&,slang::ast::Visibility&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,VariableLifetime *args_2,Visibility *args_3)

{
  string_view name;
  ClassPropertySymbol *pCVar1;
  SourceLocation in_RCX;
  size_t in_RDX;
  char *in_RSI;
  ClassPropertySymbol *in_R8;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pCVar1 = (ClassPropertySymbol *)
           allocate((BumpAllocator *)in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  name._M_str = in_RSI;
  name._M_len = in_RDX;
  ast::ClassPropertySymbol::ClassPropertySymbol
            (in_R8,name,in_RCX,(VariableLifetime)((ulong)*(undefined8 *)(in_RSI + 8) >> 0x20),
             (Visibility)*(undefined8 *)(in_RSI + 8));
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }